

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  ostringstream local_190 [376];
  
  bVar1 = std::operator==(arg,"OWNER_READ");
  if (bVar1) {
    *(byte *)((long)permissions + 1) = *(byte *)((long)permissions + 1) | 1;
  }
  else {
    bVar1 = std::operator==(arg,"OWNER_WRITE");
    if (bVar1) {
      *(byte *)permissions = (byte)*permissions | 0x80;
    }
    else {
      bVar1 = std::operator==(arg,"OWNER_EXECUTE");
      if (bVar1) {
        *(byte *)permissions = (byte)*permissions | 0x40;
      }
      else {
        bVar1 = std::operator==(arg,"GROUP_READ");
        if (bVar1) {
          *(byte *)permissions = (byte)*permissions | 0x20;
        }
        else {
          bVar1 = std::operator==(arg,"GROUP_WRITE");
          if (bVar1) {
            *(byte *)permissions = (byte)*permissions | 0x10;
          }
          else {
            bVar1 = std::operator==(arg,"GROUP_EXECUTE");
            if (bVar1) {
              *(byte *)permissions = (byte)*permissions | 8;
            }
            else {
              bVar1 = std::operator==(arg,"WORLD_READ");
              if (bVar1) {
                *(byte *)permissions = (byte)*permissions | 4;
              }
              else {
                bVar1 = std::operator==(arg,"WORLD_WRITE");
                if (bVar1) {
                  *(byte *)permissions = (byte)*permissions | 2;
                }
                else {
                  bVar1 = std::operator==(arg,"WORLD_EXECUTE");
                  if (bVar1) {
                    *(byte *)permissions = (byte)*permissions | 1;
                  }
                  else {
                    bVar1 = std::operator==(arg,"SETUID");
                    if (bVar1) {
                      *(byte *)((long)permissions + 1) = *(byte *)((long)permissions + 1) | 8;
                    }
                    else {
                      bVar1 = std::operator==(arg,"SETGID");
                      if (!bVar1) {
                        std::__cxx11::ostringstream::ostringstream(local_190);
                        poVar2 = std::operator<<((ostream *)local_190,this->Name);
                        poVar2 = std::operator<<(poVar2," given invalid permission \"");
                        poVar2 = std::operator<<(poVar2,(string *)arg);
                        std::operator<<(poVar2,"\".");
                        this_00 = &this->FileCommand->super_cmCommand;
                        std::__cxx11::stringbuf::str();
                        cmCommand::SetError(this_00,&local_1b0);
                        std::__cxx11::string::~string((string *)&local_1b0);
                        std::__cxx11::ostringstream::~ostringstream(local_190);
                        return false;
                      }
                      *(byte *)((long)permissions + 1) = *(byte *)((long)permissions + 1) | 4;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool CheckPermissions(std::string const& arg, mode_t& permissions)
    {
    if(arg == "OWNER_READ")         { permissions |= mode_owner_read; }
    else if(arg == "OWNER_WRITE")   { permissions |= mode_owner_write; }
    else if(arg == "OWNER_EXECUTE") { permissions |= mode_owner_execute; }
    else if(arg == "GROUP_READ")    { permissions |= mode_group_read; }
    else if(arg == "GROUP_WRITE")   { permissions |= mode_group_write; }
    else if(arg == "GROUP_EXECUTE") { permissions |= mode_group_execute; }
    else if(arg == "WORLD_READ")    { permissions |= mode_world_read; }
    else if(arg == "WORLD_WRITE")   { permissions |= mode_world_write; }
    else if(arg == "WORLD_EXECUTE") { permissions |= mode_world_execute; }
    else if(arg == "SETUID")        { permissions |= mode_setuid; }
    else if(arg == "SETGID")        { permissions |= mode_setgid; }
    else
      {
      std::ostringstream e;
      e << this->Name << " given invalid permission \"" << arg << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }
    return true;
    }